

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O0

int cpu_scaling_min_freq(int cpu)

{
  int iVar1;
  char *local_28;
  char *filename;
  FILE *fp;
  int local_10;
  int min_freq;
  int cpu_local;
  
  local_28 = (char *)0x0;
  local_10 = cpu;
  iVar1 = asprintf(&local_28,"/sys/devices/system/cpu/cpu%d/cpufreq/scaling_min_freq",
                   (ulong)(uint)cpu);
  if (iVar1 == -1) {
    min_freq = -1;
  }
  else {
    filename = (char *)fopen(local_28,"r");
    free(local_28);
    if (filename == (char *)0x0) {
      min_freq = -1;
    }
    else {
      iVar1 = __isoc99_fscanf(filename,"%d",(long)&fp + 4);
      if (iVar1 != 1) {
        fp._4_4_ = -1;
      }
      fclose((FILE *)filename);
      min_freq = fp._4_4_;
    }
  }
  return min_freq;
}

Assistant:

int
cpu_scaling_min_freq(int cpu)
{
	int min_freq;
	FILE *fp;
	char *filename = NULL;
	if (asprintf(&filename,
		"/sys/devices/system/cpu/cpu%d/cpufreq/scaling_min_freq",
			cpu) == -1) {
		return -1;
	}
	fp = fopen(filename, "r");
	free(filename);
	if (!fp)
		return -1;
	if (fscanf(fp, "%d", &min_freq) != 1)
		min_freq = -1;
	fclose(fp);
	return min_freq;
}